

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O0

CURLcode resolver_error(connectdata *conn)

{
  CURLcode local_1c;
  char *pcStack_18;
  CURLcode result;
  char *host_or_proxy;
  connectdata *conn_local;
  
  if (((conn->bits).httpproxy & 1U) == 0) {
    pcStack_18 = "host";
    local_1c = CURLE_COULDNT_RESOLVE_HOST;
  }
  else {
    pcStack_18 = "proxy";
    local_1c = CURLE_COULDNT_RESOLVE_PROXY;
  }
  Curl_failf(conn->data,"Could not resolve %s: %s",pcStack_18,(conn->async).hostname);
  return local_1c;
}

Assistant:

static CURLcode resolver_error(struct connectdata *conn)
{
  const char *host_or_proxy;
  CURLcode result;

  if(conn->bits.httpproxy) {
    host_or_proxy = "proxy";
    result = CURLE_COULDNT_RESOLVE_PROXY;
  }
  else {
    host_or_proxy = "host";
    result = CURLE_COULDNT_RESOLVE_HOST;
  }

  failf(conn->data, "Could not resolve %s: %s", host_or_proxy,
        conn->async.hostname);

  return result;
}